

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlineprops.cpp
# Opt level: O1

void test_join_styles(Am_Drawonable *d)

{
  (**(code **)(*(long *)d + 0x160))(d,&miter_ls,&white,0xa0,0x14,100,0x4b,0);
  draw_corners(d,0xa0,0x14,100,0x4b);
  (**(code **)(*(long *)d + 0x160))(d,&round_ls,&white,0xa0,0x78,100,0x4b,0);
  draw_corners(d,0xa0,0x78,100,0x4b);
  (**(code **)(*(long *)d + 0x160))(d,&bevel_ls,&white,0xa0,0xdc,100,0x4b,0);
  draw_corners(d,0xa0,0xdc,100,0x4b);
  return;
}

Assistant:

void
test_join_styles(Am_Drawonable *d)
{
  d->Draw_Rectangle(miter_ls, white, 160, 20, 100, 75);
  draw_corners(d, 160, 20, 100, 75);
  d->Draw_Rectangle(round_ls, white, 160, 120, 100, 75);
  draw_corners(d, 160, 120, 100, 75);
  d->Draw_Rectangle(bevel_ls, white, 160, 220, 100, 75);
  draw_corners(d, 160, 220, 100, 75);
}